

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraCodeBlocksGenerator::AppendTarget
          (cmExtraCodeBlocksGenerator *this,cmXMLWriter *xml,string *targetName,
          cmGeneratorTarget *target,char *make,cmLocalGenerator *lg,char *compiler,string *makeFlags
          )

{
  pointer *ppbVar1;
  undefined8 uVar2;
  bool bVar3;
  TargetType TVar4;
  char *pcVar5;
  iterator iVar6;
  iterator iVar7;
  ulong uVar8;
  reference pbVar9;
  allocator local_7a9;
  string local_7a8;
  allocator local_781;
  string local_780;
  string local_760;
  allocator local_739;
  string local_738;
  allocator local_711;
  string local_710;
  allocator local_6e9;
  string local_6e8;
  string local_6c8;
  allocator local_6a1;
  string local_6a0;
  allocator local_679;
  string local_678;
  allocator local_651;
  string local_650;
  string local_630;
  allocator local_609;
  string local_608;
  allocator local_5e1;
  string local_5e0;
  string local_5c0;
  allocator local_599;
  string local_598;
  allocator local_571;
  string local_570;
  int local_550;
  allocator local_549;
  string local_548;
  char *local_528;
  allocator local_519;
  string local_518;
  allocator local_4f1;
  string local_4f0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4d0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4c8;
  const_iterator i;
  const_iterator end;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4a0;
  const_iterator local_498;
  undefined1 local_490 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs_1;
  string local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_448;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_440;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_438;
  const_iterator local_430;
  undefined1 local_428 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  string local_408;
  undefined1 local_3e8 [8];
  string systemIncludeDirs;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3b0;
  const_iterator local_3a8;
  allocator local_399;
  string local_398;
  undefined1 local_378 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allIncludeDirs;
  allocator local_321;
  string local_320;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_300;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2f8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2f0;
  const_iterator di;
  string local_2e0;
  undefined1 local_2c0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cdefs;
  string local_2a0;
  allocator local_279;
  string local_278;
  allocator local_251;
  string local_250;
  allocator local_229;
  string local_228;
  allocator local_201;
  string local_200;
  int local_1dc [2];
  allocator local_1d1;
  string local_1d0;
  string local_1b0;
  undefined1 local_190 [8];
  string location;
  string local_168;
  undefined1 local_148 [8];
  string buildType;
  string local_120;
  char *local_100;
  char *executableOutputDir;
  string local_f0;
  char *local_d0;
  char *runtimeOutputDir;
  undefined1 local_c0 [8];
  string workingDir;
  int cbTargetType;
  allocator local_61;
  string local_60 [8];
  string makefileName;
  cmMakefile *makefile;
  cmLocalGenerator *lg_local;
  char *make_local;
  cmGeneratorTarget *target_local;
  string *targetName_local;
  cmXMLWriter *xml_local;
  cmExtraCodeBlocksGenerator *this_local;
  
  makefileName.field_2._8_8_ = cmLocalGenerator::GetMakefile(lg);
  pcVar5 = cmLocalGenerator::GetCurrentBinaryDirectory(lg);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,pcVar5,&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::operator+=(local_60,"/Makefile");
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&cbTargetType,"Target",(allocator *)(workingDir.field_2._M_local_buf + 0xf));
  cmXMLWriter::StartElement(xml,(string *)&cbTargetType);
  std::__cxx11::string::~string((string *)&cbTargetType);
  std::allocator<char>::~allocator((allocator<char> *)(workingDir.field_2._M_local_buf + 0xf));
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"title",targetName);
  if (target == (cmGeneratorTarget *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_518,"Option",&local_519);
    cmXMLWriter::StartElement(xml,&local_518);
    std::__cxx11::string::~string((string *)&local_518);
    std::allocator<char>::~allocator((allocator<char> *)&local_519);
    local_528 = cmLocalGenerator::GetCurrentBinaryDirectory(lg);
    cmXMLWriter::Attribute<char_const*>(xml,"working_dir",&local_528);
    cmXMLWriter::EndElement(xml);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_548,"Option",&local_549);
    cmXMLWriter::StartElement(xml,&local_548);
    std::__cxx11::string::~string((string *)&local_548);
    std::allocator<char>::~allocator((allocator<char> *)&local_549);
    local_550 = 4;
    cmXMLWriter::Attribute<int>(xml,"type",&local_550);
    cmXMLWriter::EndElement(xml);
  }
  else {
    workingDir.field_2._8_4_ = GetCBTargetType(this,target);
    pcVar5 = cmLocalGenerator::GetCurrentBinaryDirectory(lg);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_c0,pcVar5,(allocator *)((long)&runtimeOutputDir + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&runtimeOutputDir + 7));
    TVar4 = cmGeneratorTarget::GetType(target);
    uVar2 = makefileName.field_2._8_8_;
    if (TVar4 == EXECUTABLE) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_f0,"CMAKE_RUNTIME_OUTPUT_DIRECTORY",
                 (allocator *)((long)&executableOutputDir + 7));
      pcVar5 = cmMakefile::GetDefinition((cmMakefile *)uVar2,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&executableOutputDir + 7));
      uVar2 = makefileName.field_2._8_8_;
      local_d0 = pcVar5;
      if (pcVar5 == (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_120,"EXECUTABLE_OUTPUT_PATH",
                   (allocator *)(buildType.field_2._M_local_buf + 0xf));
        pcVar5 = cmMakefile::GetDefinition((cmMakefile *)uVar2,&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        std::allocator<char>::~allocator((allocator<char> *)(buildType.field_2._M_local_buf + 0xf));
        local_100 = pcVar5;
        if (pcVar5 != (char *)0x0) {
          std::__cxx11::string::operator=((string *)local_c0,pcVar5);
        }
      }
      else {
        std::__cxx11::string::operator=((string *)local_c0,pcVar5);
      }
    }
    uVar2 = makefileName.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_168,"CMAKE_BUILD_TYPE",
               (allocator *)(location.field_2._M_local_buf + 0xf));
    pcVar5 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar2,&local_168);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_148,pcVar5,(allocator *)(location.field_2._M_local_buf + 0xe));
    std::allocator<char>::~allocator((allocator<char> *)(location.field_2._M_local_buf + 0xe));
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator((allocator<char> *)(location.field_2._M_local_buf + 0xf));
    std::__cxx11::string::string((string *)local_190);
    TVar4 = cmGeneratorTarget::GetType(target);
    if (TVar4 == OBJECT_LIBRARY) {
      CreateDummyTargetFile_abi_cxx11_(&local_1b0,this,lg,target);
      std::__cxx11::string::operator=((string *)local_190,(string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
    }
    else {
      pcVar5 = cmGeneratorTarget::GetLocation(target,(string *)local_148);
      std::__cxx11::string::operator=((string *)local_190,pcVar5);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1d0,"Option",&local_1d1);
    cmXMLWriter::StartElement(xml,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    cmXMLWriter::Attribute<std::__cxx11::string>
              (xml,"output",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190);
    local_1dc[1] = 0;
    cmXMLWriter::Attribute<int>(xml,"prefix_auto",local_1dc + 1);
    local_1dc[0] = 0;
    cmXMLWriter::Attribute<int>(xml,"extension_auto",local_1dc);
    cmXMLWriter::EndElement(xml);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_200,"Option",&local_201);
    cmXMLWriter::StartElement(xml,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
    cmXMLWriter::Attribute<std::__cxx11::string>
              (xml,"working_dir",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
    cmXMLWriter::EndElement(xml);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_228,"Option",&local_229);
    cmXMLWriter::StartElement(xml,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::allocator<char>::~allocator((allocator<char> *)&local_229);
    cmXMLWriter::Attribute<char[3]>(xml,"object_output",(char (*) [3])0xb98fe7);
    cmXMLWriter::EndElement(xml);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_250,"Option",&local_251);
    cmXMLWriter::StartElement(xml,&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator((allocator<char> *)&local_251);
    cmXMLWriter::Attribute<int>(xml,"type",(int *)(workingDir.field_2._M_local_buf + 8));
    cmXMLWriter::EndElement(xml);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_278,"Option",&local_279);
    cmXMLWriter::StartElement(xml,&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator((allocator<char> *)&local_279);
    cmXMLWriter::Attribute<char_const*>(xml,"compiler",&compiler);
    cmXMLWriter::EndElement(xml);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_2a0,"Compiler",
               (allocator *)
               ((long)&cdefs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    cmXMLWriter::StartElement(xml,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&cdefs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2c0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2e0,"C",(allocator *)((long)&di._M_current + 7));
    cmGeneratorTarget::GetCompileDefinitions
              (target,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_2c0,(string *)local_148,&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&di._M_current + 7));
    local_2f8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2c0);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_2f0,&local_2f8);
    while( true ) {
      local_300._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2c0);
      bVar3 = __gnu_cxx::operator!=(&local_2f0,&local_300);
      if (!bVar3) break;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_320,"Add",&local_321);
      cmXMLWriter::StartElement(xml,&local_320);
      std::__cxx11::string::~string((string *)&local_320);
      std::allocator<char>::~allocator((allocator<char> *)&local_321);
      pbVar9 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_2f0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &allIncludeDirs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,"-D",pbVar9);
      cmXMLWriter::Attribute<std::__cxx11::string>
                (xml,"option",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &allIncludeDirs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &allIncludeDirs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cmXMLWriter::EndElement(xml);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_2f0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&includes.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_378);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_398,"C",&local_399);
    cmLocalGenerator::GetIncludeDirectories
              (lg,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_378,target,&local_398,(string *)local_148,true);
    std::__cxx11::string::~string((string *)&local_398);
    std::allocator<char>::~allocator((allocator<char> *)&local_399);
    ppbVar1 = &includes.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_3b0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)ppbVar1);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_3a8,&local_3b0);
    iVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_378);
    iVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_378);
    systemIncludeDirs.field_2._8_8_ =
         std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
         insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                   ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)ppbVar1,
                    local_3a8,
                    (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     )iVar6._M_current,
                    (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     )iVar7._M_current);
    uVar2 = makefileName.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_408,"CMAKE_EXTRA_GENERATOR_CXX_SYSTEM_INCLUDE_DIRS",
               (allocator *)
               ((long)&dirs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar5 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar2,&local_408);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_3e8,pcVar5,
               (allocator *)
               ((long)&dirs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&dirs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
    std::__cxx11::string::~string((string *)&local_408);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&dirs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_428);
      cmSystemTools::ExpandListArgument
                ((string *)local_3e8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_428,false);
      ppbVar1 = &includes.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_438._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)ppbVar1);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_430,&local_438);
      local_440._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_428);
      local_448 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_428);
      local_450 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             ppbVar1,local_430,local_440,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )local_448);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_428);
    }
    uVar2 = makefileName.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_470,"CMAKE_EXTRA_GENERATOR_C_SYSTEM_INCLUDE_DIRS",
               (allocator *)
               ((long)&dirs_1.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar5 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar2,&local_470);
    std::__cxx11::string::operator=((string *)local_3e8,pcVar5);
    std::__cxx11::string::~string((string *)&local_470);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&dirs_1.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_490);
      cmSystemTools::ExpandListArgument
                ((string *)local_3e8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_490,false);
      ppbVar1 = &includes.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_4a0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)ppbVar1);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_498,&local_4a0);
      iVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_490);
      iVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_490);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)ppbVar1,
                 local_498,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )iVar6._M_current,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )iVar7._M_current);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_490);
    }
    i = cmRemoveDuplicates<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&includes.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_4d0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&includes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_4c8,&local_4d0);
    while (bVar3 = __gnu_cxx::operator!=(&local_4c8,&i), bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_4f0,"Add",&local_4f1);
      cmXMLWriter::StartElement(xml,&local_4f0);
      std::__cxx11::string::~string((string *)&local_4f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
      pbVar9 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_4c8);
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,"directory",pbVar9);
      cmXMLWriter::EndElement(xml);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_4c8);
    }
    cmXMLWriter::EndElement(xml);
    std::__cxx11::string::~string((string *)local_3e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_378);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&includes.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2c0);
    std::__cxx11::string::~string((string *)local_190);
    std::__cxx11::string::~string((string *)local_148);
    std::__cxx11::string::~string((string *)local_c0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_570,"MakeCommands",&local_571);
  cmXMLWriter::StartElement(xml,&local_570);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_598,"Build",&local_599);
  cmXMLWriter::StartElement(xml,&local_598);
  std::__cxx11::string::~string((string *)&local_598);
  std::allocator<char>::~allocator((allocator<char> *)&local_599);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5e0,make,&local_5e1);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  BuildMakeCommand(&local_5c0,this,&local_5e0,pcVar5,targetName,makeFlags);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"command",&local_5c0);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
  cmXMLWriter::EndElement(xml);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_608,"CompileFile",&local_609);
  cmXMLWriter::StartElement(xml,&local_608);
  std::__cxx11::string::~string((string *)&local_608);
  std::allocator<char>::~allocator((allocator<char> *)&local_609);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_650,make,&local_651);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_678,"\"$file\"",&local_679);
  BuildMakeCommand(&local_630,this,&local_650,pcVar5,&local_678,makeFlags);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"command",&local_630);
  std::__cxx11::string::~string((string *)&local_630);
  std::__cxx11::string::~string((string *)&local_678);
  std::allocator<char>::~allocator((allocator<char> *)&local_679);
  std::__cxx11::string::~string((string *)&local_650);
  std::allocator<char>::~allocator((allocator<char> *)&local_651);
  cmXMLWriter::EndElement(xml);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6a0,"Clean",&local_6a1);
  cmXMLWriter::StartElement(xml,&local_6a0);
  std::__cxx11::string::~string((string *)&local_6a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6e8,make,&local_6e9);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_710,"clean",&local_711);
  BuildMakeCommand(&local_6c8,this,&local_6e8,pcVar5,&local_710,makeFlags);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"command",&local_6c8);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::__cxx11::string::~string((string *)&local_710);
  std::allocator<char>::~allocator((allocator<char> *)&local_711);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6e9);
  cmXMLWriter::EndElement(xml);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_738,"DistClean",&local_739);
  cmXMLWriter::StartElement(xml,&local_738);
  std::__cxx11::string::~string((string *)&local_738);
  std::allocator<char>::~allocator((allocator<char> *)&local_739);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_780,make,&local_781);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7a8,"clean",&local_7a9);
  BuildMakeCommand(&local_760,this,&local_780,pcVar5,&local_7a8,makeFlags);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"command",&local_760);
  std::__cxx11::string::~string((string *)&local_760);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7a9);
  std::__cxx11::string::~string((string *)&local_780);
  std::allocator<char>::~allocator((allocator<char> *)&local_781);
  cmXMLWriter::EndElement(xml);
  cmXMLWriter::EndElement(xml);
  cmXMLWriter::EndElement(xml);
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

void cmExtraCodeBlocksGenerator::AppendTarget(
  cmXMLWriter& xml, const std::string& targetName, cmGeneratorTarget* target,
  const char* make, const cmLocalGenerator* lg, const char* compiler,
  const std::string& makeFlags)
{
  cmMakefile const* makefile = lg->GetMakefile();
  std::string makefileName = lg->GetCurrentBinaryDirectory();
  makefileName += "/Makefile";

  xml.StartElement("Target");
  xml.Attribute("title", targetName);

  if (target != CM_NULLPTR) {
    int cbTargetType = this->GetCBTargetType(target);
    std::string workingDir = lg->GetCurrentBinaryDirectory();
    if (target->GetType() == cmStateEnums::EXECUTABLE) {
      // Determine the directory where the executable target is created, and
      // set the working directory to this dir.
      const char* runtimeOutputDir =
        makefile->GetDefinition("CMAKE_RUNTIME_OUTPUT_DIRECTORY");
      if (runtimeOutputDir != CM_NULLPTR) {
        workingDir = runtimeOutputDir;
      } else {
        const char* executableOutputDir =
          makefile->GetDefinition("EXECUTABLE_OUTPUT_PATH");
        if (executableOutputDir != CM_NULLPTR) {
          workingDir = executableOutputDir;
        }
      }
    }

    std::string buildType = makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
    std::string location;
    if (target->GetType() == cmStateEnums::OBJECT_LIBRARY) {
      location =
        this->CreateDummyTargetFile(const_cast<cmLocalGenerator*>(lg), target);
    } else {
      location = target->GetLocation(buildType);
    }

    xml.StartElement("Option");
    xml.Attribute("output", location);
    xml.Attribute("prefix_auto", 0);
    xml.Attribute("extension_auto", 0);
    xml.EndElement();

    xml.StartElement("Option");
    xml.Attribute("working_dir", workingDir);
    xml.EndElement();

    xml.StartElement("Option");
    xml.Attribute("object_output", "./");
    xml.EndElement();

    xml.StartElement("Option");
    xml.Attribute("type", cbTargetType);
    xml.EndElement();

    xml.StartElement("Option");
    xml.Attribute("compiler", compiler);
    xml.EndElement();

    xml.StartElement("Compiler");

    // the compilerdefines for this target
    std::vector<std::string> cdefs;
    target->GetCompileDefinitions(cdefs, buildType, "C");

    // Expand the list.
    for (std::vector<std::string>::const_iterator di = cdefs.begin();
         di != cdefs.end(); ++di) {
      xml.StartElement("Add");
      xml.Attribute("option", "-D" + *di);
      xml.EndElement();
    }

    // the include directories for this target
    std::vector<std::string> allIncludeDirs;

    std::vector<std::string> includes;
    lg->GetIncludeDirectories(includes, target, "C", buildType);

    allIncludeDirs.insert(allIncludeDirs.end(), includes.begin(),
                          includes.end());

    std::string systemIncludeDirs = makefile->GetSafeDefinition(
      "CMAKE_EXTRA_GENERATOR_CXX_SYSTEM_INCLUDE_DIRS");
    if (!systemIncludeDirs.empty()) {
      std::vector<std::string> dirs;
      cmSystemTools::ExpandListArgument(systemIncludeDirs, dirs);
      allIncludeDirs.insert(allIncludeDirs.end(), dirs.begin(), dirs.end());
    }

    systemIncludeDirs = makefile->GetSafeDefinition(
      "CMAKE_EXTRA_GENERATOR_C_SYSTEM_INCLUDE_DIRS");
    if (!systemIncludeDirs.empty()) {
      std::vector<std::string> dirs;
      cmSystemTools::ExpandListArgument(systemIncludeDirs, dirs);
      allIncludeDirs.insert(allIncludeDirs.end(), dirs.begin(), dirs.end());
    }

    std::vector<std::string>::const_iterator end =
      cmRemoveDuplicates(allIncludeDirs);

    for (std::vector<std::string>::const_iterator i = allIncludeDirs.begin();
         i != end; ++i) {
      xml.StartElement("Add");
      xml.Attribute("directory", *i);
      xml.EndElement();
    }

    xml.EndElement(); // Compiler
  } else              // e.g. all and the GLOBAL and UTILITY targets
  {
    xml.StartElement("Option");
    xml.Attribute("working_dir", lg->GetCurrentBinaryDirectory());
    xml.EndElement();

    xml.StartElement("Option");
    xml.Attribute("type", 4);
    xml.EndElement();
  }

  xml.StartElement("MakeCommands");

  xml.StartElement("Build");
  xml.Attribute("command", this->BuildMakeCommand(make, makefileName.c_str(),
                                                  targetName, makeFlags));
  xml.EndElement();

  xml.StartElement("CompileFile");
  xml.Attribute("command", this->BuildMakeCommand(make, makefileName.c_str(),
                                                  "\"$file\"", makeFlags));
  xml.EndElement();

  xml.StartElement("Clean");
  xml.Attribute("command", this->BuildMakeCommand(make, makefileName.c_str(),
                                                  "clean", makeFlags));
  xml.EndElement();

  xml.StartElement("DistClean");
  xml.Attribute("command", this->BuildMakeCommand(make, makefileName.c_str(),
                                                  "clean", makeFlags));
  xml.EndElement();

  xml.EndElement(); // MakeCommands
  xml.EndElement(); // Target
}